

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

bool __thiscall mpt::unique_array<double>::set(unique_array<double> *this,long pos,double *v)

{
  content<double> *pcVar1;
  bool bVar2;
  ulong uVar3;
  content<double> *pcVar4;
  
  pcVar4 = (this->_ref)._ref;
  if (pos < 0) {
    if (pcVar4 == (content<double> *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (pcVar4->super_buffer)._used >> 3;
    }
    pos = pos + uVar3;
    if (pos < 0) {
      return false;
    }
  }
  else {
    if (pcVar4 == (content<double> *)0x0) {
      return false;
    }
    if ((pcVar4->super_buffer)._used >> 3 <= (ulong)pos) {
      return false;
    }
  }
  bVar2 = detach(this);
  if (!bVar2) {
    return false;
  }
  pcVar1 = (this->_ref)._ref;
  pcVar4 = pcVar1 + 1;
  if (pcVar1 == (content<double> *)0x0) {
    pcVar4 = (content<double> *)0x0;
  }
  (&(pcVar4->super_buffer)._vptr_buffer)[pos] = (_func_int **)*v;
  return true;
}

Assistant:

bool set(long pos, T const &v)
	{
		if (pos < 0) {
			if ((pos += length()) < 0) {
				return false;
			}
		}
		else if (pos >= length()) {
			return false;
		}
		if (!detach()) {
			return false;
		}
		T *t = begin();
		t[pos] = v;
		return true;
	}